

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O1

void __thiscall
glslang::TParseVersions::checkDeprecated
          (TParseVersions *this,TSourceLoc *loc,int profileMask,int depVersion,char *featureDesc)

{
  TInfoSink *this_00;
  size_type *psVar1;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar2;
  size_t sVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  *paVar5;
  char text [16];
  TPoolAllocator *local_108;
  size_type *local_100;
  size_type local_f8;
  size_type local_f0;
  undefined8 uStack_e8;
  pool_allocator<char> local_d8;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_a8;
  TPoolAllocator *local_80;
  char *local_78;
  size_type local_70;
  char local_68 [16];
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  
  if (((this->profile & profileMask) != EBadProfile) && (depVersion <= this->version)) {
    if (this->forwardCompatible == true) {
      (*this->_vptr_TParseVersions[0x2d])
                (this,loc,"deprecated, may be removed in future release",featureDesc,"",
                 this->_vptr_TParseVersions[0x2d]);
      return;
    }
    if ((this->messages & EShMsgSuppressWarnings) == EShMsgDefault) {
      this_00 = this->infoSink;
      local_d8.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_58,featureDesc,&local_d8);
      pbVar2 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                         (&local_58," deprecated in version ");
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      local_d0._M_dataplus.super_allocator_type.allocator =
           (pbVar2->_M_dataplus).super_allocator_type.allocator;
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
                *)(pbVar2->_M_dataplus)._M_p;
      paVar4 = &pbVar2->field_2;
      if (paVar5 == paVar4) {
        local_d0.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
        local_d0.field_2._8_4_ = *(undefined4 *)((long)&pbVar2->field_2 + 8);
        local_d0.field_2._12_4_ = *(undefined4 *)((long)&pbVar2->field_2 + 0xc);
      }
      else {
        local_d0.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
        local_d0._M_dataplus._M_p = (pointer)paVar5;
      }
      local_d0._M_string_length = pbVar2->_M_string_length;
      (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
      pbVar2->_M_string_length = 0;
      (pbVar2->field_2)._M_local_buf[0] = '\0';
      snprintf((char *)&local_108,0x10,"%d",(ulong)(uint)depVersion);
      local_80 = GetThreadPoolAllocator();
      local_78 = local_68;
      sVar3 = strlen((char *)&local_108);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_80,&local_108,(long)&local_108 + sVar3);
      pbVar2 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::_M_append
                         (&local_d0,local_78,local_70);
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      local_a8._M_dataplus.super_allocator_type.allocator =
           (pbVar2->_M_dataplus).super_allocator_type.allocator;
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
                *)(pbVar2->_M_dataplus)._M_p;
      paVar4 = &pbVar2->field_2;
      if (paVar5 == paVar4) {
        local_a8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
        local_a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
      }
      else {
        local_a8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
        local_a8._M_dataplus._M_p = (pointer)paVar5;
      }
      local_a8._M_string_length = pbVar2->_M_string_length;
      (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
      pbVar2->_M_string_length = 0;
      (pbVar2->field_2)._M_local_buf[0] = '\0';
      pbVar2 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                         (&local_a8,"; may be removed in future release");
      local_100 = &local_f0;
      local_108 = (pbVar2->_M_dataplus).super_allocator_type.allocator;
      psVar1 = (size_type *)(pbVar2->_M_dataplus)._M_p;
      paVar5 = &pbVar2->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
           *)psVar1 == paVar5) {
        local_f0 = paVar5->_M_allocated_capacity;
        uStack_e8 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
      }
      else {
        local_f0 = paVar5->_M_allocated_capacity;
        local_100 = psVar1;
      }
      local_f8 = pbVar2->_M_string_length;
      (pbVar2->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar2->_M_string_length = 0;
      (pbVar2->field_2)._M_local_buf[0] = '\0';
      TInfoSinkBase::message
                (&this_00->info,EPrefixWarning,(char *)local_100,loc,
                 (bool)((byte)(this->messages >> 0x10) & 1),
                 (bool)((byte)(this->messages >> 0x11) & 1));
    }
  }
  return;
}

Assistant:

void TParseVersions::checkDeprecated(const TSourceLoc& loc, int profileMask, int depVersion, const char* featureDesc)
{
    if (profile & profileMask) {
        if (version >= depVersion) {
            if (forwardCompatible)
                error(loc, "deprecated, may be removed in future release", featureDesc, "");
            else if (! suppressWarnings())
                infoSink.info.message(EPrefixWarning, (TString(featureDesc) + " deprecated in version " +
                                                       String(depVersion) + "; may be removed in future release").c_str(), 
                                                       loc, messages & EShMsgAbsolutePath, messages & EShMsgDisplayErrorColumn);
        }
    }
}